

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

string * __thiscall
duckdb::Exception::
ConstructMessage<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          LogicalType *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          LogicalType params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_2_00;
  LogicalType params_3_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6_00;
  undefined8 uVar2;
  undefined8 in_stack_fffffffffffffeb8;
  _Alloc_hider _Var3;
  undefined1 in_stack_fffffffffffffed0 [24];
  _Alloc_hider _Var4;
  undefined1 in_stack_fffffffffffffef0 [24];
  _Alloc_hider _Var5;
  undefined1 in_stack_ffffffffffffff10 [24];
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [40];
  undefined1 local_58 [16];
  LogicalType local_48;
  
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  values.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var5._M_p = &stack0xffffffffffffff18;
  pcVar1 = (msg->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff08,pcVar1,pcVar1 + msg->_M_string_length);
  _Var4._M_p = &stack0xfffffffffffffef8;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffee8,pcVar1,pcVar1 + params->_M_string_length);
  LogicalType::LogicalType((LogicalType *)local_80,(LogicalType *)params_1);
  _Var3._M_p = &stack0xfffffffffffffed8;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffec8,*(long *)params_2,
             (long)&((params_2->type_info_).internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ExtraTypeInfo + *(long *)params_2);
  LogicalType::LogicalType(&local_48,(LogicalType *)params_3);
  local_a0[0] = local_90;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_a0,*(long *)params_4._0_8_,
             *(long *)(params_4._0_8_ + 8) + *(long *)params_4._0_8_);
  local_c0._M_allocated_capacity = (size_type)local_b0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,
             (params_4.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             _vptr_ExtraTypeInfo,
             *(long *)&(params_4.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       )->type +
             (long)(params_4.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   _vptr_ExtraTypeInfo);
  uVar2 = 0x12420c9;
  local_80._24_8_ = local_58;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)(local_80 + 0x18),
             (params_4.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_vptr__Sp_counted_base,
             *(long *)&(params_4.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count +
             (long)(params_4.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_vptr__Sp_counted_base);
  params_2_00._M_string_length = (size_type)local_a0;
  params_2_00._M_dataplus._M_p = (pointer)&local_48;
  params_2_00.field_2._M_allocated_capacity = (size_type)&local_c0;
  params_2_00.field_2._8_8_ = (string *)(local_80 + 0x18);
  params_3_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_stack_fffffffffffffeb8;
  params_3_00.id_ = (char)uVar2;
  params_3_00.physical_type_ = (char)((ulong)uVar2 >> 8);
  params_3_00._2_6_ = (int6)((ulong)uVar2 >> 0x10);
  params_3_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__return_storage_ptr__;
  params_4_00._M_string_length = in_stack_fffffffffffffed0._0_8_;
  params_4_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffed0._8_16_;
  params_4_00._M_dataplus._M_p = _Var3._M_p;
  params_5_00._M_string_length = in_stack_fffffffffffffef0._0_8_;
  params_5_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffef0._8_16_;
  params_5_00._M_dataplus._M_p = _Var4._M_p;
  params_6_00._M_string_length = in_stack_ffffffffffffff10._0_8_;
  params_6_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff10._8_16_;
  params_6_00._M_dataplus._M_p = _Var5._M_p;
  ConstructMessageRecursive<std::__cxx11::string,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,duckdb::LogicalType,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,this,(string *)&values,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             &stack0xffffffffffffff08,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
             (LogicalType *)&stack0xfffffffffffffec8,params_2_00,params_3_00,params_4_00,params_5_00
             ,params_6_00);
  if ((undefined1 *)local_80._24_8_ != local_58) {
    operator_delete((void *)local_80._24_8_);
  }
  if ((undefined1 *)local_c0._0_8_ != local_b0) {
    operator_delete((void *)local_c0._0_8_);
  }
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  LogicalType::~LogicalType(&local_48);
  if (_Var3._M_p != &stack0xfffffffffffffed8) {
    operator_delete(_Var3._M_p);
  }
  LogicalType::~LogicalType((LogicalType *)local_80);
  if (_Var4._M_p != &stack0xfffffffffffffef8) {
    operator_delete(_Var4._M_p);
  }
  if ((pointer)_Var5._M_p != (pointer)&stack0xffffffffffffff18) {
    operator_delete(_Var5._M_p);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector(&values);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}